

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_AddExt_Test::TestBody(X509Test_AddExt_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  void *pvVar2;
  allocator_type *paVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  initializer_list<unsigned_char> __l_02;
  initializer_list<Extension> __l_03;
  initializer_list<Extension> __l_04;
  initializer_list<Extension> __l_05;
  initializer_list<Extension> __l_06;
  initializer_list<Extension> __l_07;
  initializer_list<Extension> __l_08;
  initializer_list<Extension> __l_09;
  initializer_list<Extension> __l_10;
  initializer_list<Extension> __l_11;
  initializer_list<Extension> __l_12;
  initializer_list<Extension> __l_13;
  initializer_list<Extension> __l_14;
  initializer_list<Extension> __l_15;
  initializer_list<Extension> __l_16;
  initializer_list<Extension> __l_17;
  initializer_list<Extension> __l_18;
  initializer_list<Extension> __l_19;
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> skid2_der;
  UniquePtr<X509> x509;
  anon_class_8_1_89930684 expect_extensions;
  vector<unsigned_char,_std::allocator<unsigned_char>_> basic1_der;
  vector<unsigned_char,_std::allocator<unsigned_char>_> skid1_der;
  vector<unsigned_char,_std::allocator<unsigned_char>_> basic2_der;
  UniquePtr<BASIC_CONSTRAINTS> basic1_obj;
  uint8_t *inp;
  UniquePtr<BASIC_CONSTRAINTS> basic2_obj;
  UniquePtr<ASN1_OCTET_STRING> skid2_obj;
  UniquePtr<ASN1_OCTET_STRING> skid1_obj;
  AssertHelper local_138;
  vector<Extension,_std::allocator<Extension>_> local_130;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  undefined4 local_f8;
  undefined1 local_f4;
  void *local_f0;
  void *pvStack_e8;
  long local_e0;
  undefined4 local_d8;
  undefined1 local_d4;
  void *local_d0;
  void *pvStack_c8;
  long local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  _Head_base<0UL,_x509_st_*,_false> local_a0;
  anon_class_8_1_89930684 local_98;
  undefined1 local_90 [8];
  AssertHelperData *local_88;
  pointer local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false> local_48;
  AssertHelperData *local_40;
  _Head_base<0UL,_BASIC_CONSTRAINTS_st_*,_false> local_38;
  _Head_base<0UL,_asn1_string_st_*,_false> local_30;
  _Head_base<0UL,_asn1_string_st_*,_false> local_28;
  
  local_a0._M_head_impl = (x509_st *)X509_new();
  local_90[0] = (internal)((X509 *)local_a0._M_head_impl != (X509 *)0x0);
  local_88 = (AssertHelperData *)0x0;
  if ((X509 *)local_a0._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_118,(internal *)local_90,(AssertionResult *)0x5a5403,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1593,(char *)local_118);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if (local_118 != (undefined1  [8])&local_108) {
      operator_delete((void *)local_118,local_108._M_allocated_capacity + 1);
    }
    if ((AssertHelperData *)
        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 8))();
    }
    if (local_88 != (AssertHelperData *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    }
  }
  else {
    local_98.x509 = (UniquePtr<X509> *)&local_a0;
    local_118._0_2_ = 0x30;
    __l._M_len = 2;
    __l._M_array = local_118;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_90,__l,
               (allocator_type *)&local_60);
    local_40 = (AssertHelperData *)CONCAT71(local_90._1_7_,local_90[0]);
    local_48._M_head_impl =
         (BASIC_CONSTRAINTS_st *)
         d2i_BASIC_CONSTRAINTS
                   ((BASIC_CONSTRAINTS **)0x0,(uchar **)&local_40,(long)local_88 - (long)local_40);
    local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_88;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)local_118,"inp","basic1_der.data() + basic1_der.size()",
               (uchar **)&local_40,(uchar **)&local_60);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_60);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_78,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15ae,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
      if ((AssertHelperData *)
          local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_60.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0xff01010330;
    __l_00._M_len = 5;
    __l_00._M_array = local_118;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_60,__l_00,(allocator_type *)&local_78);
    local_40 = (AssertHelperData *)
               local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_38._M_head_impl =
         (BASIC_CONSTRAINTS_st *)
         d2i_BASIC_CONSTRAINTS
                   ((BASIC_CONSTRAINTS **)0x0,(uchar **)&local_40,
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)local_118,"inp","basic2_der.data() + basic2_der.size()",
               (uchar **)&local_40,(uchar **)&local_78);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15b5,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
      if ((AssertHelperData *)
          local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_2_ = 4;
    __l_01._M_len = 2;
    __l_01._M_array = local_118;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_78,__l_01,(allocator_type *)&local_b8);
    local_40 = (AssertHelperData *)
               local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_28._M_head_impl =
         (asn1_string_st *)
         d2i_ASN1_OCTET_STRING
                   ((ASN1_OCTET_STRING **)0x0,(uchar **)&local_40,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)local_118,"inp","skid1_der.data() + skid1_der.size()",(uchar **)&local_40
               ,(uchar **)&local_b8);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b8);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15bc,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_130,(Message *)&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_130);
      if ((AssertHelperData *)
          local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_b8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_3_ = 0x610104;
    __l_02._M_len = 3;
    __l_02._M_array = local_118;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_b8,__l_02,(allocator_type *)&local_130);
    local_40 = (AssertHelperData *)
               local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_30._M_head_impl =
         (asn1_string_st *)
         d2i_ASN1_OCTET_STRING
                   ((ASN1_OCTET_STRING **)0x0,(uchar **)&local_40,
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish;
    testing::internal::CmpHelperEQ<unsigned_char_const*,unsigned_char*>
              ((internal *)local_118,"inp","skid2_der.data() + skid2_der.size()",(uchar **)&local_40
               ,(uchar **)&local_130);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15c3,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118 = (undefined1  [8])0x0;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    TestBody::anon_class_8_1_89930684::operator()
              (&local_98,(vector<Extension,_std::allocator<Extension>_> *)local_118);
    std::vector<Extension,_std::allocator<Extension>_>::~vector
              ((vector<Extension,_std::allocator<Extension>_> *)local_118);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_48._M_head_impl,1,0);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 0L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15cb;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15cb,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000057;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_03,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x52,local_28._M_head_impl,0,0);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 82, skid1_obj.get(), 0, 0L)"
               ,(int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15cf;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15cf,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000057;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x52;
    local_f4 = 0;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_04._M_len = 2;
    __l_04._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_04,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_38._M_head_impl,0,0);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"0",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 0L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15d6;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15d6,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000057;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x52;
    local_f4 = 0;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_05._M_len = 2;
    __l_05._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_05,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_38._M_head_impl,0,4);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 4L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15de;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15de,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000057;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x52;
    local_f4 = 0;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_06._M_len = 2;
    __l_06._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_06,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_38._M_head_impl,0,2);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 2L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15e5;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15e5,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x57;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x52;
    local_f4 = 0;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_07._M_len = 2;
    __l_07._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_07,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x52,local_30._M_head_impl,1,3);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 82, skid2_obj.get(), 1, 3L)"
               ,(int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15ec;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15ec,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x57;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x52;
    local_f4 = 1;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_08._M_len = 2;
    __l_08._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_08,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ = X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,(void *)0x0,0,5);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15f2;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15f2,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_09._M_len = 1;
    __l_09._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_09,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_138.data_._0_4_ = X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,(void *)0x0,0,5);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"0","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15f7;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15f7,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_10._M_len = 1;
    __l_10._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_10,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                          _M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_48._M_head_impl,1,3);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"0",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 3L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x15fd;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x15fd,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_11._M_len = 1;
    __l_11._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_11,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_48._M_head_impl,1,2);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 2L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x1603;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1603,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x57;
    local_f4 = 1;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_12._M_len = 2;
    __l_12._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_12,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ = X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,(void *)0x0,0,5);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x1609;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1609,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_13._M_len = 1;
    __l_13._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_13,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_48._M_head_impl,1,4);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 4L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x160f;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x160f,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x57;
    local_f4 = 1;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_14._M_len = 2;
    __l_14._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_14,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ = X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,(void *)0x0,0,5);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x1615;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1615,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_15._M_len = 1;
    __l_15._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_15,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_48._M_head_impl,1,1);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic1_obj.get(), 1, 1L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x161b;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x161b,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x57;
    local_f4 = 1;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_16._M_len = 2;
    __l_16._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_16,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ =
         X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,local_38._M_head_impl,0,1);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1",
               "X509_add1_ext_i2d(x509.get(), 87, basic2_obj.get(), 0, 1L)",(int *)paVar3,
               (int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x1622;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1622,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x57;
    local_f4 = 1;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_88 - CONCAT71(local_90._1_7_,local_90[0]);
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_88 - (long)CONCAT71(local_90._1_7_,local_90[0]);
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,(void *)CONCAT71(local_90._1_7_,local_90[0]),sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    local_d8 = 0x57;
    local_d4 = 0;
    local_d0 = (void *)0x0;
    pvStack_c8 = (void *)0x0;
    local_c0 = 0;
    uVar4 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_c0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_d0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_c8 = pvVar2;
      memmove(pvVar2,local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_c8 = (void *)((long)pvVar2 + sVar5);
    __l_17._M_len = 3;
    __l_17._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_17,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x60;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ = X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,(void *)0x0,0,5);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x1629;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1629,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    local_f8 = 0x57;
    local_f4 = 0;
    local_f0 = (void *)0x0;
    pvStack_e8 = (void *)0x0;
    local_e0 = 0;
    uVar4 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pvVar2 = operator_new(uVar4);
    }
    local_e0 = uVar4 + (long)pvVar2;
    sVar5 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    local_f0 = pvVar2;
    if (sVar5 != 0) {
      pvStack_e8 = pvVar2;
      memmove(pvVar2,local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    pvStack_e8 = (void *)((long)pvVar2 + sVar5);
    __l_18._M_len = 2;
    __l_18._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_18,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    lVar6 = 0x40;
    do {
      pvVar2 = *(void **)((long)&local_130.super__Vector_base<Extension,_std::allocator<Extension>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar6);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,*(long *)(local_118 + lVar6 + -8) - (long)pvVar2);
      }
      lVar6 = lVar6 + -0x20;
    } while (lVar6 != 0);
    local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_138.data_._0_4_ = X509_add1_ext_i2d((X509 *)local_a0._M_head_impl,0x57,(void *)0x0,0,5);
    paVar3 = (allocator_type *)&local_130;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_118,"1","X509_add1_ext_i2d(x509.get(), 87, nullptr, 0, 5L)",
               (int *)paVar3,(int *)&local_138);
    if (local_118[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_130);
      if (pbStack_110 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = (pbStack_110->_M_dataplus)._M_p;
      }
      paVar3 = (allocator_type *)0x162d;
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x162d,pcVar7);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      if (local_130.super__Vector_base<Extension,_std::allocator<Extension>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (**(code **)(*(long *)local_130.super__Vector_base<Extension,_std::allocator<Extension>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    local_118._0_5_ = 0x100000052;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_108._M_allocated_capacity = 0;
    local_108._8_8_ = 0;
    uVar4 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      if ((long)uVar4 < 0) {
        std::__throw_bad_alloc();
      }
      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(uVar4);
    }
    local_108._8_8_ = uVar4 + (long)pbVar1;
    sVar5 = (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start;
    pbStack_110 = pbVar1;
    if (sVar5 != 0) {
      local_108._M_allocated_capacity = (size_type)pbVar1;
      memmove(pbVar1,local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,sVar5);
    }
    local_108._M_allocated_capacity = (long)pbVar1 + sVar5;
    __l_19._M_len = 1;
    __l_19._M_array = (iterator)local_118;
    std::vector<Extension,_std::allocator<Extension>_>::vector(&local_130,__l_19,paVar3);
    TestBody::anon_class_8_1_89930684::operator()(&local_98,&local_130);
    std::vector<Extension,_std::allocator<Extension>_>::~vector(&local_130);
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete(pbStack_110,local_108._8_8_ - (long)pbStack_110);
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_30);
    if ((AssertHelperData *)
        local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<asn1_string_st,_bssl::internal::Deleter> *)&local_28);
    if ((AssertHelperData *)
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&local_38);
    if ((AssertHelperData *)
        local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
      operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<BASIC_CONSTRAINTS_st,_bssl::internal::Deleter> *)&local_48);
    pvVar2 = (void *)CONCAT71(local_90._1_7_,local_90[0]);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,(long)local_80 - (long)pvVar2);
    }
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_a0);
  return;
}

Assistant:

TEST(X509Test, AddExt) {
  bssl::UniquePtr<X509> x509(X509_new());
  ASSERT_TRUE(x509);

  struct Extension {
    int nid;
    bool critical;
    std::vector<uint8_t> data;
  };
  auto expect_extensions = [&](const std::vector<Extension> &exts) {
    ASSERT_EQ(static_cast<size_t>(X509_get_ext_count(x509.get())), exts.size());
    for (size_t i = 0; i < exts.size(); i++) {
      SCOPED_TRACE(i);
      const X509_EXTENSION *ext = X509_get_ext(x509.get(), static_cast<int>(i));
      EXPECT_EQ(OBJ_obj2nid(X509_EXTENSION_get_object(ext)), exts[i].nid);
      EXPECT_EQ(X509_EXTENSION_get_critical(ext), exts[i].critical ? 1 : 0);
      const ASN1_OCTET_STRING *data = X509_EXTENSION_get_data(ext);
      EXPECT_EQ(Bytes(ASN1_STRING_get0_data(data), ASN1_STRING_length(data)),
                Bytes(exts[i].data));
    }
  };

  // Make a few sample extensions.

  // SEQUENCE {}
  std::vector<uint8_t> basic1_der = {0x30, 0x00};
  const uint8_t *inp = basic1_der.data();
  bssl::UniquePtr<BASIC_CONSTRAINTS> basic1_obj(
      d2i_BASIC_CONSTRAINTS(nullptr, &inp, basic1_der.size()));
  EXPECT_EQ(inp, basic1_der.data() + basic1_der.size());

  // SEQUENCE { BOOLEAN { TRUE } }
  std::vector<uint8_t> basic2_der = {0x30, 0x03, 0x01, 0x01, 0xff};
  inp = basic2_der.data();
  bssl::UniquePtr<BASIC_CONSTRAINTS> basic2_obj(
      d2i_BASIC_CONSTRAINTS(nullptr, &inp, basic2_der.size()));
  EXPECT_EQ(inp, basic2_der.data() + basic2_der.size());

  // OCTET_STRING {}
  std::vector<uint8_t> skid1_der = {0x04, 0x00};
  inp = skid1_der.data();
  bssl::UniquePtr<ASN1_OCTET_STRING> skid1_obj(
      d2i_ASN1_OCTET_STRING(nullptr, &inp, skid1_der.size()));
  EXPECT_EQ(inp, skid1_der.data() + skid1_der.size());

  // OCTET_STRING { "a" }
  std::vector<uint8_t> skid2_der = {0x04, 0x01, 0x61};
  inp = skid2_der.data();
  bssl::UniquePtr<ASN1_OCTET_STRING> skid2_obj(
      d2i_ASN1_OCTET_STRING(nullptr, &inp, skid2_der.size()));
  EXPECT_EQ(inp, skid2_der.data() + skid2_der.size());

  // Initially, the extension list is empty.
  expect_extensions({});

  // Adding extensions works with the default settings.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der}});
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_subject_key_identifier,
                                 skid1_obj.get(),
                                 /*crit=*/0, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // By default, we cannot add duplicates.
  EXPECT_EQ(
      0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_DEFAULT));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_KEEP_EXISTING| silently keeps the existing extension if already
  // present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_KEEP_EXISTING));
  expect_extensions({{NID_basic_constraints, true, basic1_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_REPLACE| replaces it.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_REPLACE));
  expect_extensions({{NID_basic_constraints, false, basic2_der},
                     {NID_subject_key_identifier, false, skid1_der}});

  // |X509V3_ADD_REPLACE_EXISTING| also replaces matches.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_subject_key_identifier,
                                 skid2_obj.get(),
                                 /*crit=*/1, X509V3_ADD_REPLACE_EXISTING));
  expect_extensions({{NID_basic_constraints, false, basic2_der},
                     {NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_DELETE| ignores the value and deletes the extension.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // Not finding an extension to delete is an error.
  EXPECT_EQ(0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_REPLACE_EXISTING| fails if it cannot find a match.
  EXPECT_EQ(
      0, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_REPLACE_EXISTING));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_REPLACE| adds a new extension if not preseent.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_REPLACE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // Delete the extension again.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_KEEP_EXISTING| adds a new extension if not preseent.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_KEEP_EXISTING));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // Delete the extension again.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});

  // |X509V3_ADD_APPEND| adds a new extension if not present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic1_obj.get(),
                           /*crit=*/1, X509V3_ADD_APPEND));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der}});

  // |X509V3_ADD_APPEND| keeps adding duplicates (invalid) even if present.
  EXPECT_EQ(
      1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, basic2_obj.get(),
                           /*crit=*/0, X509V3_ADD_APPEND));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, true, basic1_der},
                     {NID_basic_constraints, false, basic2_der}});

  // |X509V3_ADD_DELETE| only deletes one extension at a time.
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der},
                     {NID_basic_constraints, false, basic2_der}});
  EXPECT_EQ(1, X509_add1_ext_i2d(x509.get(), NID_basic_constraints, nullptr, 0,
                                 X509V3_ADD_DELETE));
  expect_extensions({{NID_subject_key_identifier, true, skid2_der}});
}